

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ru_pairing.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
::_update_barcode(RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
                  *this,ID_index birthPivot,Pos_index death)

{
  uint uVar1;
  bool bVar2;
  pointer ppVar3;
  reference pvVar4;
  reference pvVar5;
  ID_index local_3c;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_30;
  uint local_24;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Stack_20;
  Pos_index pivotBirth;
  iterator it;
  Pos_index death_local;
  ID_index birthPivot_local;
  RU_pairing<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
  *this_local;
  
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._0_4_ =
       death;
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur._4_4_ =
       birthPivot;
  _Stack_20._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::find(&this->idToPosition_,
              (key_type *)
              ((long)&it.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                      _M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
       ::end(&this->idToPosition_);
  bVar2 = std::__detail::operator==(&stack0xffffffffffffffe0,&local_30);
  if (bVar2) {
    local_3c = it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
               _M_cur._4_4_;
  }
  else {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false> *
                        )&stack0xffffffffffffffe0);
    local_3c = ppVar3->second;
  }
  uVar1 = (Pos_index)
          it.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur;
  local_24 = local_3c;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->indexToBar_,(ulong)local_3c);
  pvVar5 = std::
           vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
           ::operator[](&this->barcode_,(ulong)*pvVar4);
  pvVar5->death = uVar1;
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->indexToBar_,(ulong)local_24);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->indexToBar_,pvVar4);
  return;
}

Assistant:

void _update_barcode(ID_index birthPivot, Pos_index death) {
    auto it = idToPosition_.find(birthPivot);
    Pos_index pivotBirth = it == idToPosition_.end() ? birthPivot : it->second;
    if constexpr (Master_matrix::hasFixedBarcode || !Master_matrix::Option_list::has_removable_columns) {
      barcode_[indexToBar_[pivotBirth]].death = death;
      indexToBar_.push_back(indexToBar_[pivotBirth]);
    } else {
      auto& barIt = indexToBar_.at(pivotBirth);
      barIt->death = death;
      indexToBar_.try_emplace(death, barIt);  // list so iterators are stable
    }
  }